

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_util.cpp
# Opt level: O1

bool saveToFile(string *filePath,void *data,size_t dataSize)

{
  long lVar1;
  ofstream file;
  long local_218;
  filebuf local_210 [20];
  undefined4 auStack_1fc [55];
  ios_base local_120;
  
  std::ofstream::ofstream(&local_218);
  lVar1 = *(long *)(local_218 + -0x18);
  *(undefined4 *)((long)auStack_1fc + lVar1) = 5;
  std::ios::clear((int)&local_218 + (int)lVar1);
  std::ofstream::open((string *)&local_218,(_Ios_Openmode)filePath);
  std::ostream::write((char *)&local_218,(long)data);
  std::ofstream::close();
  local_218 = _VTT;
  *(undefined8 *)(local_210 + *(long *)(_VTT + -0x18) + -8) = _locale;
  std::filebuf::~filebuf(local_210);
  std::ios_base::~ios_base(&local_120);
  return true;
}

Assistant:

bool saveToFile(const std::string& filePath, const void* data, size_t dataSize)
{
	try {
		std::ofstream file;
		file.exceptions(std::ofstream::failbit | std::ofstream::badbit);
		file.open(filePath, std::ofstream::out | std::ofstream::binary);
		file.write(reinterpret_cast<const char*>(data), dataSize);
		file.close();
		return true;
	}
	catch (const std::ios_base::failure& e) {
		std::cerr << e.what() << std::endl;
		return false;
	}
}